

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simd_fft.hpp
# Opt level: O2

void __thiscall
re::fft::simd_fft<float,_256L>::stage0
          (simd_fft<float,_256L> *this,span<std::complex<float>,_256L> out)

{
  float *pfVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  uint i;
  ulong uVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  
  for (uVar4 = 0; uVar4 < 0x100; uVar4 = uVar4 + 2) {
    uVar2 = *(undefined8 *)((long)out.storage_.data_ + uVar4 * 8);
    uVar3 = *(undefined8 *)((long)out.storage_.data_ + 8 + uVar4 * 8);
    fVar7 = (float)uVar3;
    fVar8 = (float)((ulong)uVar3 >> 0x20);
    fVar5 = (float)uVar2;
    fVar6 = (float)((ulong)uVar2 >> 0x20);
    pfVar1 = (float *)((long)out.storage_.data_ + uVar4 * 8);
    *pfVar1 = fVar7 + fVar5;
    pfVar1[1] = fVar8 + fVar6;
    pfVar1[2] = fVar5 - fVar7;
    pfVar1[3] = fVar6 - fVar8;
  }
  return;
}

Assistant:

void stage0(gsl::span<cpx_t, N> out) const noexcept {
        for (auto i = 0u; i < N; i += 2) {
            auto t = out[i + 1];
            out[i + 1] = out[i] - t;
            out[i] += t;
        }
    }